

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_demovfs.c
# Opt level: O2

int demoWrite(unqlite_file *pFile,void *zBuf,unqlite_int64 iAmt,unqlite_int64 iOfst)

{
  int iVar1;
  int iVar2;
  size_t __n;
  long lVar3;
  
  if (pFile[3].pMethods == (unqlite_io_methods *)0x0) {
    iVar1 = demoDirectWrite((DemoFile *)pFile,zBuf,(int)iAmt,iOfst);
    return iVar1;
  }
  do {
    if (iAmt < 1) {
      return 0;
    }
    iVar1 = *(int *)&pFile[4].pMethods;
    if (((long)iVar1 == 0x2000) || ((long)&(pFile[5].pMethods)->iVersion + (long)iVar1 != iOfst)) {
      iVar1 = demoFlushBuffer((DemoFile *)pFile);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = *(int *)&pFile[4].pMethods;
    }
    if (iVar1 == 0) {
      lVar3 = 0;
    }
    else {
      lVar3 = (long)iVar1;
      if ((long)&(pFile[5].pMethods)->iVersion + lVar3 != iOfst) {
        __assert_fail("p->nBuffer==0 || p->iBufferOfst+p->nBuffer==i",
                      "/workspace/llm4binary/github/license_c_cmakelists/symisc[P]unqlite/example/demovfs/unqlite_demovfs.c"
                      ,0x121,
                      "int demoWrite(unqlite_file *, const void *, unqlite_int64, unqlite_int64)");
      }
    }
    iVar2 = 0x2000 - iVar1;
    if (iAmt < 0x2000 - iVar1) {
      iVar2 = (int)iAmt;
    }
    pFile[5].pMethods = (unqlite_io_methods *)(iOfst - lVar3);
    __n = (size_t)iVar2;
    memcpy((void *)((long)&(pFile[3].pMethods)->iVersion + lVar3),zBuf,__n);
    *(int *)&pFile[4].pMethods = *(int *)&pFile[4].pMethods + iVar2;
    iAmt = iAmt - __n;
    iOfst = iOfst + __n;
    zBuf = (void *)((long)zBuf + __n);
  } while( true );
}

Assistant:

static int demoWrite(
  unqlite_file *pFile, 
  const void *zBuf,
#if defined(_MSC_VER) || defined(__MINGW32__)
  int iAmt,
#else
  unqlite_int64 iAmt,
#endif /* defined(_MSC_VER) || defined(__MINGW32__) */
  unqlite_int64 iOfst
){
  DemoFile *p = (DemoFile*)pFile;
  
  if( p->aBuffer ){
    char *z = (char *)zBuf;       /* Pointer to remaining data to write */
#if defined(_MSC_VER) || defined(__MINGW32__)
    int n = iAmt;                  /* Number of bytes at z */
#else
    unqlite_int64 n = iAmt;       /* Number of bytes at z */
#endif /* defined(_MSC_VER) || defined(__MINGW32__) */
    unqlite_int64 i = iOfst;      /* File offset to write to */

    while( n>0 ){
      int nCopy;                  /* Number of bytes to copy into buffer */

      /* If the buffer is full, or if this data is not being written directly
      ** following the data already buffered, flush the buffer. Flushing
      ** the buffer is a no-op if it is empty.  
      */
      if( p->nBuffer==UNQLITE_DEMOVFS_BUFFERSZ || p->iBufferOfst+p->nBuffer!=i ){
        int rc = demoFlushBuffer(p);
        if( rc!=UNQLITE_OK ){
          return rc;
        }
      }
      assert( p->nBuffer==0 || p->iBufferOfst+p->nBuffer==i );
      p->iBufferOfst = i - p->nBuffer;

      /* Copy as much data as possible into the buffer. */
      nCopy = UNQLITE_DEMOVFS_BUFFERSZ - p->nBuffer;
      if( nCopy>n ){
        nCopy = n;
      }
      memcpy(&p->aBuffer[p->nBuffer], z, nCopy);
      p->nBuffer += nCopy;

      n -= nCopy;
      i += nCopy;
      z += nCopy;
    }
  }else{
    return demoDirectWrite(p, zBuf, iAmt, iOfst);
  }

  return UNQLITE_OK;
}